

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool ra_portable_deserialize(roaring_array_t *answer,char *buf,size_t maxbytes,size_t *readbytes)

{
  ushort uVar1;
  uint uVar2;
  uint16_t *puVar3;
  uint32_t cap;
  _Bool _Var4;
  uint8_t uVar5;
  int32_t iVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  array_container_t *container;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  char *pcVar13;
  ushort *buf_00;
  char *local_50;
  
  *readbytes = 4;
  if (maxbytes < 4) {
    ra_portable_deserialize_cold_13();
    return false;
  }
  uVar2 = *(uint *)buf;
  uVar10 = (ulong)uVar2;
  if ((uVar2 & 0xffff) == 0x303b || uVar10 == 0x303a) {
    if ((uVar2 & 0xffff) == 0x303b) {
      uVar9 = (ulong)((uVar2 >> 0x10) + 8 >> 3);
      uVar7 = uVar9 + 4;
      *readbytes = uVar7;
      if (maxbytes < uVar7) {
        ra_portable_deserialize_cold_1();
        return false;
      }
      local_50 = buf + 4;
      uVar10 = (ulong)((uVar2 >> 0x10) + 1);
      pcVar13 = local_50 + uVar9;
    }
    else {
      *readbytes = 8;
      if (maxbytes < 8) {
        ra_portable_deserialize_cold_12();
        return false;
      }
      uVar10 = (ulong)*(uint *)(buf + 4);
      if (0x10000 < (int)*(uint *)(buf + 4)) {
        pcVar13 = "You cannot have so many containers, the data must be corrupted: %d\n";
        goto LAB_00119241;
      }
      pcVar13 = buf + 8;
      uVar7 = 8;
      local_50 = (char *)0x0;
    }
    cap = (uint32_t)uVar10;
    uVar7 = uVar7 + (long)(int)(cap * 2) * 2;
    *readbytes = uVar7;
    if (maxbytes < uVar7) {
      ra_portable_deserialize_cold_11();
    }
    else {
      _Var4 = ra_init_with_capacity(answer,cap);
      if (_Var4) {
        if (0 < (int)cap) {
          puVar3 = answer->keys;
          uVar7 = 0;
          do {
            puVar3[uVar7] = *(uint16_t *)(pcVar13 + uVar7 * 4);
            uVar7 = uVar7 + 1;
          } while (uVar10 != uVar7);
        }
        buf_00 = (ushort *)(pcVar13 + (long)(int)(cap * 2) * 2);
        if (((uVar2 & 0xffff) != 0x303b) || (3 < (int)cap)) {
          uVar7 = *readbytes + (long)(int)(cap * 4);
          *readbytes = uVar7;
          if (maxbytes < uVar7) {
            ra_portable_deserialize_cold_10();
            return false;
          }
          buf_00 = (ushort *)((long)buf_00 + (long)(int)(cap * 4));
        }
        if ((int)cap < 1) {
          return true;
        }
        uVar7 = 0;
        do {
          uVar1 = *(ushort *)(pcVar13 + uVar7 * 4 + 2);
          iVar6 = (int32_t)((ulong)uVar1 + 1);
          if ((uVar2 & 0xffff) == 0x303b) {
            sVar8 = *readbytes;
            uVar12 = 1 << ((byte)uVar7 & 7) & (uint)(byte)local_50[uVar7 >> 3 & 0x1fffffff];
            if ((uVar12 == 0) && (0xfff < uVar1)) goto LAB_001190e4;
            if (uVar12 == 0) goto LAB_00119180;
            uVar9 = sVar8 + 2;
            *readbytes = uVar9;
            if (maxbytes < uVar9) {
              ra_portable_deserialize_cold_5();
              return false;
            }
            uVar9 = uVar9 + (ulong)*buf_00 * 4;
            *readbytes = uVar9;
            if (maxbytes < uVar9) {
              ra_portable_deserialize_cold_4();
              return false;
            }
            iVar6 = 1;
            container = (array_container_t *)calloc(1,0x10);
            if (container == (array_container_t *)0x0) {
              ra_portable_deserialize_cold_3();
              return false;
            }
            answer->size = answer->size + 1;
            iVar6 = run_container_read(iVar6,(run_container_t *)container,(char *)buf_00);
            lVar11 = (long)iVar6;
            uVar5 = '\x03';
          }
          else {
            sVar8 = *readbytes;
            if (uVar1 < 0x1000) {
LAB_00119180:
              uVar9 = sVar8 + ((ulong)uVar1 + 1) * 2;
              *readbytes = uVar9;
              if (maxbytes < uVar9) {
                ra_portable_deserialize_cold_7();
                return false;
              }
              container = array_container_create_given_capacity(iVar6);
              if (container == (array_container_t *)0x0) {
                ra_portable_deserialize_cold_6();
                return false;
              }
              answer->size = answer->size + 1;
              iVar6 = array_container_read(iVar6,container,(char *)buf_00);
              lVar11 = (long)iVar6;
              uVar5 = '\x02';
            }
            else {
LAB_001190e4:
              *readbytes = sVar8 + 0x2000;
              if (maxbytes < sVar8 + 0x2000) {
                ra_portable_deserialize_cold_9();
                return false;
              }
              container = (array_container_t *)bitset_container_create();
              if (container == (array_container_t *)0x0) {
                ra_portable_deserialize_cold_8();
                return false;
              }
              answer->size = answer->size + 1;
              container->cardinality = iVar6;
              lVar11 = 0x2000;
              memcpy((rle16_t *)container->array,buf_00,0x2000);
              uVar5 = '\x01';
            }
          }
          buf_00 = (ushort *)((long)buf_00 + lVar11);
          answer->containers[uVar7] = container;
          answer->typecodes[uVar7] = uVar5;
          uVar7 = uVar7 + 1;
          if (uVar10 == uVar7) {
            return true;
          }
        } while( true );
      }
      ra_portable_deserialize_cold_2();
    }
  }
  else {
    pcVar13 = "I failed to find one of the right cookies. Found %u\n";
LAB_00119241:
    fprintf(_stderr,pcVar13,uVar10);
  }
  return false;
}

Assistant:

bool ra_portable_deserialize(roaring_array_t *answer, const char *buf, const size_t maxbytes, size_t * readbytes) {
    *readbytes = sizeof(int32_t);// for cookie
    if(*readbytes > maxbytes) {
      fprintf(stderr, "Ran out of bytes while reading first 4 bytes.\n");
      return false;
    }
    uint32_t cookie;
    memcpy(&cookie, buf, sizeof(int32_t));
    buf += sizeof(uint32_t);
    if ((cookie & 0xFFFF) != SERIAL_COOKIE &&
        cookie != SERIAL_COOKIE_NO_RUNCONTAINER) {
        fprintf(stderr, "I failed to find one of the right cookies. Found %" PRIu32 "\n",
                cookie);
        return false;
    }
    int32_t size;

    if ((cookie & 0xFFFF) == SERIAL_COOKIE)
        size = (cookie >> 16) + 1;
    else {
        *readbytes += sizeof(int32_t);
        if(*readbytes > maxbytes) {
          fprintf(stderr, "Ran out of bytes while reading second part of the cookie.\n");
          return false;
        }
        memcpy(&size, buf, sizeof(int32_t));
        buf += sizeof(uint32_t);
    }
    if (size > (1<<16)) {
       fprintf(stderr, "You cannot have so many containers, the data must be corrupted: %" PRId32 "\n",
                size);
       return false; // logically impossible
    }
    const char *bitmapOfRunContainers = NULL;
    bool hasrun = (cookie & 0xFFFF) == SERIAL_COOKIE;
    if (hasrun) {
        int32_t s = (size + 7) / 8;
        *readbytes += s;
        if(*readbytes > maxbytes) {// data is corrupted?
          fprintf(stderr, "Ran out of bytes while reading run bitmap.\n");
          return false;
        }
        bitmapOfRunContainers = buf;
        buf += s;
    }
    uint16_t *keyscards = (uint16_t *)buf;

    *readbytes += size * 2 * sizeof(uint16_t);
    if(*readbytes > maxbytes) {
      fprintf(stderr, "Ran out of bytes while reading key-cardinality array.\n");
      return false;
    }
    buf += size * 2 * sizeof(uint16_t);

    bool is_ok = ra_init_with_capacity(answer, size);
    if (!is_ok) {
        fprintf(stderr, "Failed to allocate memory for roaring array. Bailing out.\n");
        return false;
    }

    for (int32_t k = 0; k < size; ++k) {
        uint16_t tmp;
        memcpy(&tmp, keyscards + 2*k, sizeof(tmp));
        answer->keys[k] = tmp;
    }
    if ((!hasrun) || (size >= NO_OFFSET_THRESHOLD)) {
        *readbytes += size * 4;
        if(*readbytes > maxbytes) {// data is corrupted?
          fprintf(stderr, "Ran out of bytes while reading offsets.\n");
          ra_clear(answer);// we need to clear the containers already allocated, and the roaring array
          return false;
        }

        // skipping the offsets
        buf += size * 4;
    }
    // Reading the containers
    for (int32_t k = 0; k < size; ++k) {
        uint16_t tmp;
        memcpy(&tmp, keyscards + 2*k+1, sizeof(tmp));
        uint32_t thiscard = tmp + 1;
        bool isbitmap = (thiscard > DEFAULT_MAX_SIZE);
        bool isrun = false;
        if(hasrun) {
          if((bitmapOfRunContainers[k / 8] & (1 << (k % 8))) != 0) {
            isbitmap = false;
            isrun = true;
          }
        }
        if (isbitmap) {
            // we check that the read is allowed
            size_t containersize = BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
            *readbytes += containersize;
            if(*readbytes > maxbytes) {
              fprintf(stderr, "Running out of bytes while reading a bitset container.\n");
              ra_clear(answer);// we need to clear the containers already allocated, and the roaring array
              return false;
            }
            // it is now safe to read
            bitset_container_t *c = bitset_container_create();
            if(c == NULL) {// memory allocation failure
              fprintf(stderr, "Failed to allocate memory for a bitset container.\n");
              ra_clear(answer);// we need to clear the containers already allocated, and the roaring array
              return false;
            }
            answer->size++;
            buf += bitset_container_read(thiscard, c, buf);
            answer->containers[k] = c;
            answer->typecodes[k] = BITSET_CONTAINER_TYPE;
        } else if (isrun) {
            // we check that the read is allowed
            *readbytes += sizeof(uint16_t);
            if(*readbytes > maxbytes) {
              fprintf(stderr, "Running out of bytes while reading a run container (header).\n");
              ra_clear(answer);// we need to clear the containers already allocated, and the roaring array
              return false;
            }
            uint16_t n_runs;
            memcpy(&n_runs, buf, sizeof(uint16_t));
            size_t containersize = n_runs * sizeof(rle16_t);
            *readbytes += containersize;
            if(*readbytes > maxbytes) {// data is corrupted?
              fprintf(stderr, "Running out of bytes while reading a run container.\n");
              ra_clear(answer);// we need to clear the containers already allocated, and the roaring array
              return false;
            }
            // it is now safe to read

            run_container_t *c = run_container_create();
            if(c == NULL) {// memory allocation failure
              fprintf(stderr, "Failed to allocate memory for a run container.\n");
              ra_clear(answer);// we need to clear the containers already allocated, and the roaring array
              return false;
            }
            answer->size++;
            buf += run_container_read(thiscard, c, buf);
            answer->containers[k] = c;
            answer->typecodes[k] = RUN_CONTAINER_TYPE;
        } else {
            // we check that the read is allowed
            size_t containersize = thiscard * sizeof(uint16_t);
            *readbytes += containersize;
            if(*readbytes > maxbytes) {// data is corrupted?
              fprintf(stderr, "Running out of bytes while reading an array container.\n");
              ra_clear(answer);// we need to clear the containers already allocated, and the roaring array
              return false;
            }
            // it is now safe to read
            array_container_t *c =
                array_container_create_given_capacity(thiscard);
            if(c == NULL) {// memory allocation failure
              fprintf(stderr, "Failed to allocate memory for an array container.\n");
              ra_clear(answer);// we need to clear the containers already allocated, and the roaring array
              return false;
            }
            answer->size++;
            buf += array_container_read(thiscard, c, buf);
            answer->containers[k] = c;
            answer->typecodes[k] = ARRAY_CONTAINER_TYPE;
        }
    }
    return true;
}